

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O2

void __thiscall
GainContainer::GainContainer
          (GainContainer *this,Hypergraph *hypergraph,Partitionment *partitionment)

{
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> *this_00;
  pointer pvVar1;
  uint *puVar2;
  pointer paVar3;
  const_reference cVar4;
  uint *puVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *net;
  pointer pvVar6;
  int iVar7;
  uint cell;
  ulong __n;
  int iVar8;
  bool bVar9;
  CellsInPartitions num_cells;
  uint max_gain;
  
  this_00 = &this->num_cells_in_partitions_;
  (this->num_cells_in_partitions_).
  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_cells_in_partitions_).
  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cell_states_).
  super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cell_states_).
  super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cell_states_).
  super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_cells_in_partitions_).
  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  max_gain = Hypergraph::getMaxAdjacency(hypergraph);
  iVar7 = 2;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    std::vector<GainBuckets,std::allocator<GainBuckets>>::emplace_back<unsigned_int&>
              ((vector<GainBuckets,std::allocator<GainBuckets>> *)&this->buckets_,&max_gain);
  }
  std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
  reserve(this_00,((long)(hypergraph->nets_).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(hypergraph->nets_).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pvVar1 = (hypergraph->nets_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar6 = (hypergraph->nets_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar6 != pvVar1; pvVar6 = pvVar6 + 1) {
    num_cells._M_elems[0] = 0;
    num_cells._M_elems[1] = 0;
    puVar2 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar5 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
      cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&partitionment->partitionment_,(ulong)*puVar5);
      num_cells._M_elems[cVar4] = num_cells._M_elems[cVar4] + 1;
    }
    std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
    push_back(this_00,&num_cells);
  }
  std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::reserve
            (&this->cell_states_,
             ((long)(hypergraph->cells_).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(hypergraph->cells_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  cell = 0;
  while( true ) {
    __n = (ulong)cell;
    if ((ulong)(((long)(hypergraph->cells_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(hypergraph->cells_).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= __n) break;
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&partitionment->partitionment_,__n)
    ;
    pvVar6 = (hypergraph->cells_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar3 = (this_00->
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar7 = 0;
    for (puVar5 = *(uint **)&pvVar6[__n].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        ; puVar5 != *(pointer *)
                     ((long)&pvVar6[__n].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     + 8); puVar5 = puVar5 + 1) {
      iVar8 = 1;
      if (paVar3[*puVar5]._M_elems[cVar4] != 1) {
        iVar8 = -(uint)(paVar3[*puVar5]._M_elems[!cVar4] == 0);
      }
      iVar7 = iVar7 + iVar8;
    }
    num_cells._M_elems =
         (_Type)GainBuckets::addCell
                          ((this->buckets_).
                           super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
                           super__Vector_impl_data._M_start + cVar4,iVar7,cell);
    std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::
    emplace_back<GainContainer::CellState>(&this->cell_states_,(CellState *)&num_cells);
    cell = cell + 1;
  }
  return;
}

Assistant:

GainContainer::GainContainer(const Hypergraph &hypergraph, const Partitionment &partitionment) {
  // create PartitionGains for both parts
  auto max_gain = hypergraph.getMaxAdjacency();
  for (unsigned i = 0; i < 2; ++i)
    buckets_.emplace_back(max_gain);
  // calculate number of cells in each partition for all nets
  num_cells_in_partitions_.reserve(hypergraph.getNets().size());
  for (const auto &net : hypergraph.getNets()) {
    CellsInPartitions num_cells{0, 0};
    for (unsigned cell : net)
      ++num_cells[partitionment[cell]];
    num_cells_in_partitions_.push_back(num_cells);
  }
  // calculate gains for all cells
  cell_states_.reserve(hypergraph.getCells().size());
  for (unsigned cell = 0; cell < hypergraph.getCells().size(); ++cell) {
    auto cell_part = partitionment[cell];
    int gain = 0;
    for (unsigned net : hypergraph.getCells()[cell])
      if (num_cells_in_partitions_[net][cell_part] == 1)
        ++gain;
      else if (num_cells_in_partitions_[net][OppositePart(cell_part)] == 0)
        --gain;
    cell_states_.push_back(CellState{buckets_[cell_part].addCell(gain, cell), gain, false});
  }
}